

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemnobs.c
# Opt level: O3

size_t jpeg_mem_available(j_common_ptr cinfo,size_t min_bytes_needed,size_t max_bytes_needed,
                         size_t already_allocated)

{
  ulong uVar1;
  size_t sVar2;
  
  uVar1 = cinfo->mem->max_memory_to_use;
  sVar2 = 0;
  if (already_allocated <= uVar1) {
    sVar2 = uVar1 - already_allocated;
  }
  if (uVar1 == 0) {
    sVar2 = max_bytes_needed;
  }
  return sVar2;
}

Assistant:

GLOBAL(size_t)
jpeg_mem_available(j_common_ptr cinfo, size_t min_bytes_needed,
                   size_t max_bytes_needed, size_t already_allocated)
{
  if (cinfo->mem->max_memory_to_use) {
    if ((size_t)cinfo->mem->max_memory_to_use > already_allocated)
      return cinfo->mem->max_memory_to_use - already_allocated;
    else
      return 0;
  } else {
    /* Here we always say, "we got all you want bud!" */
    return max_bytes_needed;
  }
}